

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::compound_statement(Parser *this)

{
  bool bVar1;
  Node *this_00;
  Node *pNVar2;
  Node *operand1;
  Node *pNVar3;
  allocator local_69;
  string local_68;
  string local_48;
  
  Lexer::next_token(this->lex);
  this_00 = (Node *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_48,"",&local_69);
  Node::Node(this_00,SEQ,(Node *)0x0,(Node *)0x0,&local_48,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = tryEat(this,RBRACE);
  pNVar3 = this_00;
  if (!bVar1) {
    pNVar2 = statement(this);
    this_00->operand1 = pNVar2;
  }
  while( true ) {
    bVar1 = tryEat(this,RBRACE);
    if (bVar1) break;
    pNVar2 = (Node *)operator_new(0x48);
    operand1 = statement(this);
    std::__cxx11::string::string((string *)&local_68,"",&local_69);
    Node::Node(pNVar2,SEQ,operand1,(Node *)0x0,&local_68,(Node *)0x0,(Node *)0x0);
    pNVar3->operand2 = pNVar2;
    std::__cxx11::string::~string((string *)&local_68);
    pNVar3 = pNVar3->operand2;
  }
  Lexer::next_token(this->lex);
  return this_00;
}

Assistant:

Node* Parser::compound_statement()
{
	lex->next_token();

	Node* statement_node = new Node(node_type::SEQ);
	Node* last_node = statement_node;
	if (!tryEat(token_type::RBRACE)) last_node->operand1 = statement();

	while (!tryEat(token_type::RBRACE)) {

		last_node->operand2 = new Node(node_type::SEQ, statement());

		last_node = last_node->operand2;
	}
	lex->next_token();
	
	return statement_node;
}